

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMaxDown
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  btOverlappingPairCallback *pbVar2;
  Edge EVar3;
  uint uVar4;
  ulong uVar5;
  Edge *pEVar6;
  Handle *handle1;
  Handle *pHVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint *puVar11;
  Handle *pHVar12;
  long lVar13;
  
  lVar10 = (long)axis;
  pEVar6 = this->m_pEdges[lVar10];
  uVar5 = (ulong)edge;
  uVar4 = pEVar6[uVar5 - 1].m_pos;
  if (pEVar6[uVar5].m_pos < uVar4) {
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    pEVar6 = pEVar6 + uVar5;
    uVar8 = 1 << (sbyte)uVar9 & 3;
    puVar11 = this->m_pHandles[pEVar6->m_handle].m_maxEdges + lVar10;
    do {
      pHVar7 = this->m_pHandles + pEVar6[-1].m_handle;
      lVar13 = 0x48;
      if (((((uVar4 & 1) == 0) && (lVar13 = 0x3c, updateOverlaps)) &&
          (pHVar12 = this->m_pHandles + pEVar6->m_handle,
          *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4))
          <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar9 * 4)))) &&
         (((*(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4)
                     ) <= *(uint *)((long)pHVar7->m_maxEdges + (ulong)(uVar9 * 4)) &&
           (uVar5 = (ulong)(uVar8 * 4),
           *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
           *(uint *)((long)pHVar12->m_maxEdges + uVar5))) &&
          (uVar5 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
          *(uint *)((long)pHVar7->m_maxEdges + uVar5))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar12,pHVar7,dispatcher);
        pbVar2 = this->m_userPairCallback;
        if (pbVar2 != (btOverlappingPairCallback *)0x0) {
          (*pbVar2->_vptr_btOverlappingPairCallback[3])(pbVar2,pHVar12,pHVar7,dispatcher);
        }
      }
      piVar1 = (int *)((long)(pHVar7->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar10 * 4 + lVar13 + -0x1c);
      *piVar1 = *piVar1 + 1;
      *puVar11 = *puVar11 - 1;
      EVar3 = *pEVar6;
      *pEVar6 = pEVar6[-1];
      pEVar6[-1] = EVar3;
      uVar4 = pEVar6[-2].m_pos;
      pEVar6 = pEVar6 + -1;
    } while (EVar3.m_pos < uVar4);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;

			if (updateOverlaps  
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				
				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
			


			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}